

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O3

void __thiscall
CommandDrawInventoryBar::Tick
          (CommandDrawInventoryBar *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,
          bool hudChanged)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  CommandDrawNumber **ppCVar4;
  CommandDrawNumber *pCVar5;
  int iVar6;
  ulong uVar7;
  
  if (this->counters == (CommandDrawNumber **)0x0) {
    iVar1 = GetCounterSpacing(this,statusBar);
    uVar3 = this->size;
    ppCVar4 = (CommandDrawNumber **)operator_new__((ulong)uVar3 * 8);
    this->counters = ppCVar4;
    if ((ulong)uVar3 == 0) {
      return;
    }
    iVar6 = 0;
    uVar7 = 0;
    do {
      pCVar5 = (CommandDrawNumber *)operator_new(0xa0);
      CommandDrawNumber::CommandDrawNumber(pCVar5,(this->super_SBarInfoCommand).script);
      this->counters[uVar7] = pCVar5;
      iVar2 = iVar6;
      if (this->vertical != false) {
        iVar2 = 0;
      }
      (this->counters[uVar7]->super_CommandDrawString).startX =
           (SBarInfoCoordinate)(iVar2 + (int)this->counterX);
      iVar2 = 0;
      if (this->vertical != false) {
        iVar2 = iVar6;
      }
      (this->counters[uVar7]->super_CommandDrawString).y =
           (SBarInfoCoordinate)(iVar2 + (int)this->counterY);
      ppCVar4 = this->counters;
      pCVar5 = ppCVar4[uVar7];
      pCVar5->normalTranslation = this->translation;
      (pCVar5->super_CommandDrawString).font = this->font;
      pCVar5 = ppCVar4[uVar7];
      (pCVar5->super_CommandDrawString).spacing = this->fontSpacing;
      (pCVar5->super_CommandDrawString).field_0x5d = this->alwaysShowCounter ^ 1;
      pCVar5->value = CONSTANT;
      pCVar5->drawValue = 0x1c;
      pCVar5->length = 0x7fffffff;
      (pCVar5->super_CommandDrawString).shadow = this->shadow;
      iVar2 = this->shadowY;
      (pCVar5->super_CommandDrawString).shadowX = this->shadowX;
      (pCVar5->super_CommandDrawString).shadowY = iVar2;
      uVar7 = uVar7 + 1;
      uVar3 = this->size;
      iVar6 = iVar6 + iVar1 * 2;
    } while (uVar7 < uVar3);
  }
  else {
    uVar3 = this->size;
  }
  if (uVar3 != 0) {
    uVar7 = 0;
    do {
      (*(this->counters[uVar7]->super_CommandDrawString).super_SBarInfoCommand._vptr_SBarInfoCommand
        [5])(this->counters[uVar7],block,statusBar,hudChanged);
      uVar7 = uVar7 + 1;
    } while (uVar7 < this->size);
  }
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			// Make the counters if need be.
			if(counters == NULL)
			{
				int spacing = GetCounterSpacing(statusBar);

				counters = new CommandDrawNumber*[size];
		
				for(unsigned int i = 0;i < size;i++)
				{
					counters[i] = new CommandDrawNumber(script);
		
					counters[i]->startX = counterX + (!vertical ? spacing*i : 0);
					counters[i]->y = counterY + (vertical ? spacing*i : 0);
					counters[i]->normalTranslation = translation;
					counters[i]->font = font;
					counters[i]->spacing = fontSpacing;
					counters[i]->whenNotZero = !alwaysShowCounter;
					counters[i]->drawValue = counters[i]->value = CommandDrawNumber::CONSTANT;
					counters[i]->length = INT_MAX;
					counters[i]->shadow = shadow;
					counters[i]->shadowX = shadowX;
					counters[i]->shadowY = shadowY;
				}
			}
		
			for(unsigned int i = 0;i < size;i++)
				counters[i]->Tick(block, statusBar, hudChanged);
		}